

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<12UL> mserialize::cx_strcat<12ul>(cx_string<12UL> *strings)

{
  cx_string<12UL> *in_RDI;
  cx_string<12UL> cVar1;
  size_t s;
  size_t i;
  char *out;
  size_t size [2];
  char *data [2];
  char buffer [13];
  ulong local_60;
  ulong local_58;
  char *local_50;
  ulong local_48;
  size_t local_40;
  char *local_38;
  data_ref local_30;
  char local_25 [13];
  cx_string<12UL> *local_18;
  cx_string<12UL> local_d;
  
  local_18 = in_RDI;
  memset(local_25,0,0xd);
  local_38 = "";
  local_30 = cx_string<12UL>::data(local_18);
  local_48 = 0;
  local_40 = cx_string<12UL>::size(local_18);
  local_50 = local_25;
  for (local_58 = 1; local_58 < 2; local_58 = local_58 + 1) {
    for (local_60 = 0; local_60 < (&local_48)[local_58]; local_60 = local_60 + 1) {
      *local_50 = (&local_38)[local_58][local_60];
      local_50 = local_50 + 1;
    }
  }
  cx_string<12UL>::cx_string(&local_d,local_25);
  cVar1._data[5] = local_d._data[5];
  cVar1._data[6] = local_d._data[6];
  cVar1._data[7] = local_d._data[7];
  cVar1._data[0] = local_d._data[0];
  cVar1._data[1] = local_d._data[1];
  cVar1._data[2] = local_d._data[2];
  cVar1._data[3] = local_d._data[3];
  cVar1._data[4] = local_d._data[4];
  cVar1._data[8] = local_d._data[8];
  cVar1._data[9] = local_d._data[9];
  cVar1._data[10] = local_d._data[10];
  cVar1._data[0xb] = local_d._data[0xb];
  cVar1._data[0xc] = local_d._data[0xc];
  return (cx_string<12UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}